

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void VP8YuvToBgr32_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  __m128i B1;
  __m128i B0;
  __m128i G2;
  __m128i G1;
  __m128i G0;
  __m128i R2;
  __m128i R1;
  __m128i R0;
  __m128i bgr5;
  __m128i bgr4;
  __m128i bgr3;
  __m128i bgr2;
  __m128i bgr1;
  __m128i bgr0;
  __m128i B3;
  __m128i B2;
  __m128i G3;
  __m128i R3;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  char local_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  char local_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  
  YUV444ToRGB_SSE2(y,u,v,(__m128i *)&local_e8,(__m128i *)&local_118,(__m128i *)&local_148);
  YUV444ToRGB_SSE2(y + 8,u + 8,v + 8,(__m128i *)&local_f8,(__m128i *)&local_128,
                   (__m128i *)&local_158);
  YUV444ToRGB_SSE2(y + 0x10,u + 0x10,v + 0x10,(__m128i *)&local_108,(__m128i *)&local_138,
                   (__m128i *)&local_68);
  YUV444ToRGB_SSE2(y + 0x18,u + 0x18,v + 0x18,(__m128i *)&local_48,(__m128i *)&local_58,
                   (__m128i *)&local_78);
  local_88 = (0 < local_148) * (local_148 < 0x100) * (char)local_148 - (0xff < local_148);
  cStack_87 = (0 < sStack_146) * (sStack_146 < 0x100) * (char)sStack_146 - (0xff < sStack_146);
  cStack_86 = (0 < sStack_144) * (sStack_144 < 0x100) * (char)sStack_144 - (0xff < sStack_144);
  cStack_85 = (0 < sStack_142) * (sStack_142 < 0x100) * (char)sStack_142 - (0xff < sStack_142);
  cStack_84 = (0 < sStack_140) * (sStack_140 < 0x100) * (char)sStack_140 - (0xff < sStack_140);
  cStack_83 = (0 < sStack_13e) * (sStack_13e < 0x100) * (char)sStack_13e - (0xff < sStack_13e);
  cStack_82 = (0 < sStack_13c) * (sStack_13c < 0x100) * (char)sStack_13c - (0xff < sStack_13c);
  cStack_81 = (0 < sStack_13a) * (sStack_13a < 0x100) * (char)sStack_13a - (0xff < sStack_13a);
  cStack_80 = (0 < local_158) * (local_158 < 0x100) * (char)local_158 - (0xff < local_158);
  cStack_7f = (0 < sStack_156) * (sStack_156 < 0x100) * (char)sStack_156 - (0xff < sStack_156);
  cStack_7e = (0 < sStack_154) * (sStack_154 < 0x100) * (char)sStack_154 - (0xff < sStack_154);
  cStack_7d = (0 < sStack_152) * (sStack_152 < 0x100) * (char)sStack_152 - (0xff < sStack_152);
  cStack_7c = (0 < sStack_150) * (sStack_150 < 0x100) * (char)sStack_150 - (0xff < sStack_150);
  cStack_7b = (0 < sStack_14e) * (sStack_14e < 0x100) * (char)sStack_14e - (0xff < sStack_14e);
  cStack_7a = (0 < sStack_14c) * (sStack_14c < 0x100) * (char)sStack_14c - (0xff < sStack_14c);
  cStack_79 = (0 < sStack_14a) * (sStack_14a < 0x100) * (char)sStack_14a - (0xff < sStack_14a);
  local_98 = (0 < local_68) * (local_68 < 0x100) * (char)local_68 - (0xff < local_68);
  cStack_97 = (0 < sStack_66) * (sStack_66 < 0x100) * (char)sStack_66 - (0xff < sStack_66);
  cStack_96 = (0 < sStack_64) * (sStack_64 < 0x100) * (char)sStack_64 - (0xff < sStack_64);
  cStack_95 = (0 < sStack_62) * (sStack_62 < 0x100) * (char)sStack_62 - (0xff < sStack_62);
  cStack_94 = (0 < sStack_60) * (sStack_60 < 0x100) * (char)sStack_60 - (0xff < sStack_60);
  cStack_93 = (0 < sStack_5e) * (sStack_5e < 0x100) * (char)sStack_5e - (0xff < sStack_5e);
  cStack_92 = (0 < sStack_5c) * (sStack_5c < 0x100) * (char)sStack_5c - (0xff < sStack_5c);
  cStack_91 = (0 < sStack_5a) * (sStack_5a < 0x100) * (char)sStack_5a - (0xff < sStack_5a);
  cStack_90 = (0 < local_78) * (local_78 < 0x100) * (char)local_78 - (0xff < local_78);
  cStack_8f = (0 < sStack_76) * (sStack_76 < 0x100) * (char)sStack_76 - (0xff < sStack_76);
  cStack_8e = (0 < sStack_74) * (sStack_74 < 0x100) * (char)sStack_74 - (0xff < sStack_74);
  cStack_8d = (0 < sStack_72) * (sStack_72 < 0x100) * (char)sStack_72 - (0xff < sStack_72);
  cStack_8c = (0 < sStack_70) * (sStack_70 < 0x100) * (char)sStack_70 - (0xff < sStack_70);
  cStack_8b = (0 < sStack_6e) * (sStack_6e < 0x100) * (char)sStack_6e - (0xff < sStack_6e);
  cStack_8a = (0 < sStack_6c) * (sStack_6c < 0x100) * (char)sStack_6c - (0xff < sStack_6c);
  cStack_89 = (0 < sStack_6a) * (sStack_6a < 0x100) * (char)sStack_6a - (0xff < sStack_6a);
  local_a8 = (0 < local_118) * (local_118 < 0x100) * (char)local_118 - (0xff < local_118);
  cStack_a7 = (0 < sStack_116) * (sStack_116 < 0x100) * (char)sStack_116 - (0xff < sStack_116);
  cStack_a6 = (0 < sStack_114) * (sStack_114 < 0x100) * (char)sStack_114 - (0xff < sStack_114);
  cStack_a5 = (0 < sStack_112) * (sStack_112 < 0x100) * (char)sStack_112 - (0xff < sStack_112);
  cStack_a4 = (0 < sStack_110) * (sStack_110 < 0x100) * (char)sStack_110 - (0xff < sStack_110);
  cStack_a3 = (0 < sStack_10e) * (sStack_10e < 0x100) * (char)sStack_10e - (0xff < sStack_10e);
  cStack_a2 = (0 < sStack_10c) * (sStack_10c < 0x100) * (char)sStack_10c - (0xff < sStack_10c);
  cStack_a1 = (0 < sStack_10a) * (sStack_10a < 0x100) * (char)sStack_10a - (0xff < sStack_10a);
  cStack_a0 = (0 < local_128) * (local_128 < 0x100) * (char)local_128 - (0xff < local_128);
  cStack_9f = (0 < sStack_126) * (sStack_126 < 0x100) * (char)sStack_126 - (0xff < sStack_126);
  cStack_9e = (0 < sStack_124) * (sStack_124 < 0x100) * (char)sStack_124 - (0xff < sStack_124);
  cStack_9d = (0 < sStack_122) * (sStack_122 < 0x100) * (char)sStack_122 - (0xff < sStack_122);
  cStack_9c = (0 < sStack_120) * (sStack_120 < 0x100) * (char)sStack_120 - (0xff < sStack_120);
  cStack_9b = (0 < sStack_11e) * (sStack_11e < 0x100) * (char)sStack_11e - (0xff < sStack_11e);
  cStack_9a = (0 < sStack_11c) * (sStack_11c < 0x100) * (char)sStack_11c - (0xff < sStack_11c);
  cStack_99 = (0 < sStack_11a) * (sStack_11a < 0x100) * (char)sStack_11a - (0xff < sStack_11a);
  local_b8 = (0 < local_138) * (local_138 < 0x100) * (char)local_138 - (0xff < local_138);
  cStack_b7 = (0 < sStack_136) * (sStack_136 < 0x100) * (char)sStack_136 - (0xff < sStack_136);
  cStack_b6 = (0 < sStack_134) * (sStack_134 < 0x100) * (char)sStack_134 - (0xff < sStack_134);
  cStack_b5 = (0 < sStack_132) * (sStack_132 < 0x100) * (char)sStack_132 - (0xff < sStack_132);
  cStack_b4 = (0 < sStack_130) * (sStack_130 < 0x100) * (char)sStack_130 - (0xff < sStack_130);
  cStack_b3 = (0 < sStack_12e) * (sStack_12e < 0x100) * (char)sStack_12e - (0xff < sStack_12e);
  cStack_b2 = (0 < sStack_12c) * (sStack_12c < 0x100) * (char)sStack_12c - (0xff < sStack_12c);
  cStack_b1 = (0 < sStack_12a) * (sStack_12a < 0x100) * (char)sStack_12a - (0xff < sStack_12a);
  cStack_b0 = (0 < local_58) * (local_58 < 0x100) * (char)local_58 - (0xff < local_58);
  cStack_af = (0 < sStack_56) * (sStack_56 < 0x100) * (char)sStack_56 - (0xff < sStack_56);
  cStack_ae = (0 < sStack_54) * (sStack_54 < 0x100) * (char)sStack_54 - (0xff < sStack_54);
  cStack_ad = (0 < sStack_52) * (sStack_52 < 0x100) * (char)sStack_52 - (0xff < sStack_52);
  cStack_ac = (0 < sStack_50) * (sStack_50 < 0x100) * (char)sStack_50 - (0xff < sStack_50);
  cStack_ab = (0 < sStack_4e) * (sStack_4e < 0x100) * (char)sStack_4e - (0xff < sStack_4e);
  cStack_aa = (0 < sStack_4c) * (sStack_4c < 0x100) * (char)sStack_4c - (0xff < sStack_4c);
  cStack_a9 = (0 < sStack_4a) * (sStack_4a < 0x100) * (char)sStack_4a - (0xff < sStack_4a);
  local_c8 = (0 < local_e8) * (local_e8 < 0x100) * (char)local_e8 - (0xff < local_e8);
  cStack_c7 = (0 < sStack_e6) * (sStack_e6 < 0x100) * (char)sStack_e6 - (0xff < sStack_e6);
  cStack_c6 = (0 < sStack_e4) * (sStack_e4 < 0x100) * (char)sStack_e4 - (0xff < sStack_e4);
  cStack_c5 = (0 < sStack_e2) * (sStack_e2 < 0x100) * (char)sStack_e2 - (0xff < sStack_e2);
  cStack_c4 = (0 < sStack_e0) * (sStack_e0 < 0x100) * (char)sStack_e0 - (0xff < sStack_e0);
  cStack_c3 = (0 < sStack_de) * (sStack_de < 0x100) * (char)sStack_de - (0xff < sStack_de);
  cStack_c2 = (0 < sStack_dc) * (sStack_dc < 0x100) * (char)sStack_dc - (0xff < sStack_dc);
  cStack_c1 = (0 < sStack_da) * (sStack_da < 0x100) * (char)sStack_da - (0xff < sStack_da);
  cStack_c0 = (0 < local_f8) * (local_f8 < 0x100) * (char)local_f8 - (0xff < local_f8);
  cStack_bf = (0 < sStack_f6) * (sStack_f6 < 0x100) * (char)sStack_f6 - (0xff < sStack_f6);
  cStack_be = (0 < sStack_f4) * (sStack_f4 < 0x100) * (char)sStack_f4 - (0xff < sStack_f4);
  cStack_bd = (0 < sStack_f2) * (sStack_f2 < 0x100) * (char)sStack_f2 - (0xff < sStack_f2);
  cStack_bc = (0 < sStack_f0) * (sStack_f0 < 0x100) * (char)sStack_f0 - (0xff < sStack_f0);
  cStack_bb = (0 < sStack_ee) * (sStack_ee < 0x100) * (char)sStack_ee - (0xff < sStack_ee);
  cStack_ba = (0 < sStack_ec) * (sStack_ec < 0x100) * (char)sStack_ec - (0xff < sStack_ec);
  cStack_b9 = (0 < sStack_ea) * (sStack_ea < 0x100) * (char)sStack_ea - (0xff < sStack_ea);
  local_d8 = (0 < local_108) * (local_108 < 0x100) * (char)local_108 - (0xff < local_108);
  cStack_d7 = (0 < sStack_106) * (sStack_106 < 0x100) * (char)sStack_106 - (0xff < sStack_106);
  cStack_d6 = (0 < sStack_104) * (sStack_104 < 0x100) * (char)sStack_104 - (0xff < sStack_104);
  cStack_d5 = (0 < sStack_102) * (sStack_102 < 0x100) * (char)sStack_102 - (0xff < sStack_102);
  cStack_d4 = (0 < sStack_100) * (sStack_100 < 0x100) * (char)sStack_100 - (0xff < sStack_100);
  cStack_d3 = (0 < sStack_fe) * (sStack_fe < 0x100) * (char)sStack_fe - (0xff < sStack_fe);
  cStack_d2 = (0 < sStack_fc) * (sStack_fc < 0x100) * (char)sStack_fc - (0xff < sStack_fc);
  cStack_d1 = (0 < sStack_fa) * (sStack_fa < 0x100) * (char)sStack_fa - (0xff < sStack_fa);
  cStack_d0 = (0 < local_48) * (local_48 < 0x100) * (char)local_48 - (0xff < local_48);
  cStack_cf = (0 < sStack_46) * (sStack_46 < 0x100) * (char)sStack_46 - (0xff < sStack_46);
  cStack_ce = (0 < sStack_44) * (sStack_44 < 0x100) * (char)sStack_44 - (0xff < sStack_44);
  cStack_cd = (0 < sStack_42) * (sStack_42 < 0x100) * (char)sStack_42 - (0xff < sStack_42);
  cStack_cc = (0 < sStack_40) * (sStack_40 < 0x100) * (char)sStack_40 - (0xff < sStack_40);
  cStack_cb = (0 < sStack_3e) * (sStack_3e < 0x100) * (char)sStack_3e - (0xff < sStack_3e);
  cStack_ca = (0 < sStack_3c) * (sStack_3c < 0x100) * (char)sStack_3c - (0xff < sStack_3c);
  cStack_c9 = (0 < sStack_3a) * (sStack_3a < 0x100) * (char)sStack_3a - (0xff < sStack_3a);
  PlanarTo24b_SSE2((__m128i *)&local_88,(__m128i *)&local_98,(__m128i *)&local_a8,
                   (__m128i *)&local_b8,(__m128i *)&local_c8,(__m128i *)&local_d8,dst);
  return;
}

Assistant:

void VP8YuvToBgr32_SSE2(const uint8_t* y, const uint8_t* u, const uint8_t* v,
                        uint8_t* dst) {
  __m128i R0, R1, R2, R3, G0, G1, G2, G3, B0, B1, B2, B3;
  __m128i bgr0, bgr1, bgr2, bgr3, bgr4, bgr5;

  YUV444ToRGB_SSE2(y +  0, u +  0, v +  0, &R0, &G0, &B0);
  YUV444ToRGB_SSE2(y +  8, u +  8, v +  8, &R1, &G1, &B1);
  YUV444ToRGB_SSE2(y + 16, u + 16, v + 16, &R2, &G2, &B2);
  YUV444ToRGB_SSE2(y + 24, u + 24, v + 24, &R3, &G3, &B3);

  // Cast to 8b and store as BBBBGGGGRRRR.
  bgr0 = _mm_packus_epi16(B0, B1);
  bgr1 = _mm_packus_epi16(B2, B3);
  bgr2 = _mm_packus_epi16(G0, G1);
  bgr3 = _mm_packus_epi16(G2, G3);
  bgr4 = _mm_packus_epi16(R0, R1);
  bgr5= _mm_packus_epi16(R2, R3);

  // Pack as BGRBGRBGRBGR.
  PlanarTo24b_SSE2(&bgr0, &bgr1, &bgr2, &bgr3, &bgr4, &bgr5, dst);
}